

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

ParseResult *
tinyusdz::prim::anon_unknown_0::ParseShaderOutputTerminalAttribute<tinyusdz::Token>
          (ParseResult *__return_storage_ptr__,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *table,string *prop_name,Property *prop,string *name,
          TypedTerminalAttribute<tinyusdz::Token> *target)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  Type TVar4;
  uint32_t uVar5;
  size_type sVar6;
  Attribute *pAVar7;
  AttrMeta *pAVar8;
  AttrMeta *pAVar9;
  TypedTerminalAttribute<tinyusdz::Token> *args_2;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  allocator local_2c9;
  string local_2c8 [32];
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  allocator local_261;
  string local_260 [32];
  string local_240;
  _Base_ptr local_220;
  undefined1 local_218;
  uint32_t local_20c;
  undefined1 local_208 [4];
  uint32_t attr_underlying_type_id;
  allocator local_1e1;
  string local_1e0 [32];
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  allocator local_179;
  string local_178 [32];
  string local_158;
  _Base_ptr local_138;
  undefined1 local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator local_e1;
  string local_e0 [32];
  string local_c0;
  _Base_ptr local_a0;
  undefined1 local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  byte local_69;
  undefined1 local_68 [7];
  bool attr_is_role_type;
  string attr_type_name;
  Attribute *attr;
  TypedTerminalAttribute<tinyusdz::Token> *target_local;
  string *name_local;
  Property *prop_local;
  string *prop_name_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *table_local;
  ParseResult *ret;
  
  args_2 = target;
  ParseResult::ParseResult(__return_storage_ptr__);
  iVar3 = ::std::__cxx11::string::compare((string *)prop_name);
  if (iVar3 == 0) {
    sVar6 = ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(table,(key_type *)name);
    if (sVar6 == 0) {
      bVar1 = Property::is_attribute_connection(prop);
      if (bVar1) {
        __return_storage_ptr__->code = ConnectionNotAllowed;
        ::std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->err,
                   "Connection is not allowed for output terminal attribute.");
      }
      else {
        TVar4 = Property::get_property_type(prop);
        if (TVar4 == EmptyAttrib) {
          attr_type_name.field_2._8_8_ = Property::get_attribute(prop);
          Attribute::type_name_abi_cxx11_
                    ((string *)local_68,(Attribute *)attr_type_name.field_2._8_8_);
          local_69 = tinyusdz::value::IsRoleType((string *)local_68);
          tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
          _Var2 = ::std::operator==(&local_90,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_68);
          ::std::__cxx11::string::~string((string *)&local_90);
          if (_Var2) {
            TypedTerminalAttribute<tinyusdz::Token>::set_authored(target,true);
            pAVar7 = Property::get_attribute(prop);
            pAVar8 = Attribute::metas(pAVar7);
            pAVar9 = TypedTerminalAttribute<tinyusdz::Token>::metas(target);
            AttrMetas::operator=(pAVar9,pAVar8);
            pVar10 = ::std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::insert(table,name);
            local_a0 = (_Base_ptr)pVar10.first._M_node;
            local_98 = pVar10.second;
            __return_storage_ptr__->code = Success;
          }
          else {
            bVar1 = tinyusdz::value::TypeTraits<tinyusdz::Token>::is_role_type();
            if (bVar1) {
              if ((local_69 & 1) == 0) {
                tinyusdz::value::TypeTraits<tinyusdz::Token>::underlying_type_name_abi_cxx11_();
                _Var2 = ::std::operator==(&local_128,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_68);
                ::std::__cxx11::string::~string((string *)&local_128);
                if (_Var2) {
                  TypedTerminalAttribute<tinyusdz::Token>::set_authored(target,true);
                  TypedTerminalAttribute<tinyusdz::Token>::set_actual_type_name
                            (target,(string *)local_68);
                  pAVar7 = Property::get_attribute(prop);
                  pAVar8 = Attribute::metas(pAVar7);
                  pAVar9 = TypedTerminalAttribute<tinyusdz::Token>::metas(target);
                  AttrMetas::operator=(pAVar9,pAVar8);
                  pVar10 = ::std::
                           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::insert(table,name);
                  local_138 = (_Base_ptr)pVar10.first._M_node;
                  local_130 = pVar10.second;
                  __return_storage_ptr__->code = Success;
                }
                else {
                  __return_storage_ptr__->code = TypeMismatch;
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_178,
                             "Attribute type mismatch. {} expects type `{}`(and its underlying types) but defined as type `{}`."
                             ,&local_179);
                  tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                  fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                            (&local_158,(fmt *)local_178,name,&local_1a0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)args_2);
                  ::std::__cxx11::string::operator=
                            ((string *)&__return_storage_ptr__->err,(string *)&local_158);
                  ::std::__cxx11::string::~string((string *)&local_158);
                  ::std::__cxx11::string::~string((string *)&local_1a0);
                  ::std::__cxx11::string::~string(local_178);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_179);
                }
              }
              else {
                __return_storage_ptr__->code = TypeMismatch;
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_e0,
                           "Attribute type mismatch. {} expects type `{}` but defined as type `{}`."
                           ,&local_e1);
                tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          (&local_c0,(fmt *)local_e0,name,&local_108,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)args_2);
                ::std::__cxx11::string::operator=
                          ((string *)&__return_storage_ptr__->err,(string *)&local_c0);
                ::std::__cxx11::string::~string((string *)&local_c0);
                ::std::__cxx11::string::~string((string *)&local_108);
                ::std::__cxx11::string::~string(local_e0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_e1);
              }
            }
            else if ((local_69 & 1) == 0) {
              __return_storage_ptr__->code = TypeMismatch;
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_2c8,
                         "Property type mismatch. {} expects type `{}` but defined as type `{}`.",
                         &local_2c9);
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        (&local_2a8,(fmt *)local_2c8,name,&local_2f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)args_2);
              ::std::__cxx11::string::operator=
                        ((string *)&__return_storage_ptr__->err,(string *)&local_2a8);
              ::std::__cxx11::string::~string((string *)&local_2a8);
              ::std::__cxx11::string::~string((string *)&local_2f0);
              ::std::__cxx11::string::~string(local_2c8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
            }
            else {
              bVar1 = tinyusdz::value::TypeTraits<tinyusdz::Token>::is_role_type();
              if (bVar1) {
                __return_storage_ptr__->code = TypeMismatch;
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1e0,
                           "Attribute type mismatch. {} expects type `{}` but defined as type `{}`."
                           ,&local_1e1);
                tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          (&local_1c0,(fmt *)local_1e0,name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_208,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)args_2);
                ::std::__cxx11::string::operator=
                          ((string *)&__return_storage_ptr__->err,(string *)&local_1c0);
                ::std::__cxx11::string::~string((string *)&local_1c0);
                ::std::__cxx11::string::~string((string *)local_208);
                ::std::__cxx11::string::~string(local_1e0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
              }
              else {
                local_20c = tinyusdz::value::GetUnderlyingTypeId((string *)local_68);
                uVar5 = tinyusdz::value::TypeTraits<tinyusdz::Token>::type_id();
                if (uVar5 == local_20c) {
                  TypedTerminalAttribute<tinyusdz::Token>::set_authored(target,true);
                  TypedTerminalAttribute<tinyusdz::Token>::set_actual_type_name
                            (target,(string *)local_68);
                  pAVar7 = Property::get_attribute(prop);
                  pAVar8 = Attribute::metas(pAVar7);
                  pAVar9 = TypedTerminalAttribute<tinyusdz::Token>::metas(target);
                  AttrMetas::operator=(pAVar9,pAVar8);
                  pVar10 = ::std::
                           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::insert(table,name);
                  local_220 = (_Base_ptr)pVar10.first._M_node;
                  local_218 = pVar10.second;
                  __return_storage_ptr__->code = Success;
                }
                else {
                  __return_storage_ptr__->code = TypeMismatch;
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_260,
                             "Attribute type mismatch. {} expects type `{}` but defined as type `{}`(and its underlying types)."
                             ,&local_261);
                  tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                  fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                            (&local_240,(fmt *)local_260,name,&local_288,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)args_2);
                  ::std::__cxx11::string::operator=
                            ((string *)&__return_storage_ptr__->err,(string *)&local_240);
                  ::std::__cxx11::string::~string((string *)&local_240);
                  ::std::__cxx11::string::~string((string *)&local_288);
                  ::std::__cxx11::string::~string(local_260);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_261);
                }
              }
            }
          }
          ::std::__cxx11::string::~string((string *)local_68);
        }
        else {
          ::std::__cxx11::string::operator=
                    ((string *)&__return_storage_ptr__->err,
                     "No value should be assigned for shader output terminal attribute.");
          __return_storage_ptr__->code = InvalidConnection;
        }
      }
    }
    else {
      __return_storage_ptr__->code = AlreadyProcessed;
    }
  }
  else {
    __return_storage_ptr__->code = Unmatched;
  }
  return __return_storage_ptr__;
}

Assistant:

static ParseResult ParseShaderOutputTerminalAttribute(std::set<std::string> &table, /* inout */
  const std::string prop_name,
  const Property &prop,
  const std::string &name,
  TypedTerminalAttribute<T> &target) /* out */
{
  ParseResult ret;

#if 0 // Old code: TODO: Remove
  if (prop_name.compare(name + ".connect") == 0) {
    ret.code = ParseResult::ResultCode::ConnectionNotAllowed;
    ret.err = "Connection is not allowed for output terminal attribute.";
    return ret;
#endif
  if (prop_name.compare(name) == 0) {
    if (table.count(name)) {
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }

    if (prop.is_attribute_connection()) {
      ret.code = ParseResult::ResultCode::ConnectionNotAllowed;
      ret.err = "Connection is not allowed for output terminal attribute.";
      return ret;
    } else {

      if (prop.get_property_type() != Property::Type::EmptyAttrib) {
          DCOUT("Output Invalid shader output terminal attribute");
          ret.err = "No value should be assigned for shader output terminal attribute.";
          ret.code = ParseResult::ResultCode::InvalidConnection;
          return ret;
      }

      const Attribute &attr = prop.get_attribute();

      std::string attr_type_name = attr.type_name();

      bool attr_is_role_type = value::IsRoleType(attr_type_name);

      DCOUT("attrname = " << name);
      DCOUT("value typename = " << value::TypeTraits<T>::type_name());
      DCOUT("attr-type_name = " << attr_type_name);


      // First check if both types are same, then
      // Allow either type is role-types(e.g. allow color3f attribute for TypedTerminalAttribute<float3>)
      // TODO: Allow both role-types case?(e.g. point3f attribute for TypedTerminalAttribute<vector3f>)
      if (value::TypeTraits<T>::type_name() == attr_type_name) {
        DCOUT("Author output terminal attribute: " << name);
        target.set_authored(true);
        target.metas() = prop.get_attribute().metas();
        table.insert(name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;
      } else if (value::TypeTraits<T>::is_role_type()) {
        if (attr_is_role_type) {
          ret.code = ParseResult::ResultCode::TypeMismatch;
          ret.err = fmt::format("Attribute type mismatch. {} expects type `{}` but defined as type `{}`.", name, value::TypeTraits<T>::type_name(), attr_type_name);
          return ret;
        } else {
          if (value::TypeTraits<T>::underlying_type_name() == attr_type_name) {
            target.set_authored(true);
            target.set_actual_type_name(attr_type_name);
            target.metas() = prop.get_attribute().metas();
            table.insert(name);
            ret.code = ParseResult::ResultCode::Success;
            return ret;
          } else {
            ret.code = ParseResult::ResultCode::TypeMismatch;
            ret.err = fmt::format("Attribute type mismatch. {} expects type `{}`(and its underlying types) but defined as type `{}`.", name, value::TypeTraits<T>::type_name(), attr_type_name);
            return ret;
          }
        }
      } else if (attr_is_role_type) {
        if (value::TypeTraits<T>::is_role_type()) {
          ret.code = ParseResult::ResultCode::TypeMismatch;
          ret.err = fmt::format("Attribute type mismatch. {} expects type `{}` but defined as type `{}`.", name, value::TypeTraits<T>::type_name(), attr_type_name);
          return ret;
        } else {
          uint32_t attr_underlying_type_id = value::GetUnderlyingTypeId(attr_type_name);
          if (value::TypeTraits<T>::type_id() == attr_underlying_type_id) {
            target.set_authored(true);
            target.set_actual_type_name(attr_type_name);
            target.metas() = prop.get_attribute().metas();
            table.insert(name);
            ret.code = ParseResult::ResultCode::Success;
            return ret;
          } else {
            ret.code = ParseResult::ResultCode::TypeMismatch;
            ret.err = fmt::format("Attribute type mismatch. {} expects type `{}` but defined as type `{}`(and its underlying types).", name, value::TypeTraits<T>::type_name(), attr_type_name);
            return ret;
          }
        }

      } else {
        DCOUT("attr.type = " << attr_type_name);
        ret.code = ParseResult::ResultCode::TypeMismatch;
        ret.err = fmt::format("Property type mismatch. {} expects type `{}` but defined as type `{}`.", name, value::TypeTraits<T>::type_name(), attr_type_name);
        return ret;
      }
    }
  }

  ret.code = ParseResult::ResultCode::Unmatched;
  return ret;
}

#if 0 // TODO: Remove since not used.
// Allowed syntax:
//   "token outputs:surface"
//   "token outputs:surface.connect = </path/to/conn/>"
static ParseResult ParseShaderOutputProperty(std::set<std::string> &table, /* inout */
  const std::string prop_name,
  const Property &prop,
  const std::string &name,
  nonstd::optional<Relationship> &target) /* out */
{
  ParseResult ret;

  if (prop_name.compare(name + ".connect") == 0) {
    std::string propname = removeSuffix(name, ".connect");
    if (table.count(propname)) {
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }
    if (auto pv = prop.get_relationTarget()) {
      Relationship rel;
      rel.set(pv.value());
      rel.metas() = prop.get_attribute().metas();
      target = rel;
      table.insert(propname);
      ret.code = ParseResult::ResultCode::Success;
      return ret;
    }
  } else if (prop_name.compare(name) == 0) {
    if (table.count(name)) {
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }

    if (prop.is_connection()) {
      const Attribute &attr = prop.get_attribute();
      if (attr.is_connection()) {
        Relationship rel;
        std::vector<Path> conns = attr.connections();

        if (conns.size() == 0) {
          ret.code = ParseResult::ResultCode::InternalError;
          ret.err = "Invalid shader output attribute with connection. connection targetPath size is zero.";
          return ret;
        }

        if (conns.size() == 1) {
          rel.set(conns[0]);
        } else if (conns.size() > 1) {
          rel.set(conns);
        }

        rel.metas() = prop.get_attribute().metas();
        target = rel;
        table.insert(prop_name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;

      } else {
        ret.code = ParseResult::ResultCode::InternalError;
        ret.err = "Invalid shader output attribute with connection.";
        return ret;
      }
    } else {

      const Attribute &attr = prop.get_attribute();

      std::string attr_type_name = attr.type_name();
      if (value::TypeTraits<value::token>::type_name() == attr_type_name) {
        if (prop.get_property_type() == Property::Type::EmptyAttrib) {
          Relationship rel;
          rel.set_novalue();
          rel.metas() = prop.get_attribute().metas();
          table.insert(name);
          target = rel;
          ret.code = ParseResult::ResultCode::Success;
          return ret;
        } else {
          DCOUT("Output Invalid Property.type");
          ret.err = "Invalid connection or value assigned for output attribute.";
          ret.code = ParseResult::ResultCode::InvalidConnection;
          return ret;
        }
      } else {
        DCOUT("attr.type = " << attr.type_name());
        ret.code = ParseResult::ResultCode::TypeMismatch;
        std::stringstream ss;
        ss  << "Property type mismatch. " << name << " expects type `token` but defined as type `" << attr.type_name() << "`";
        ret.err = ss.str();
        return ret;
      }
    }
  }

  ret.code = ParseResult::ResultCode::Unmatched;
  return ret;
}
#endif

// Allowed syntax:
//   "token outputs:surface.connect = </path/to/conn/>"
static ParseResult ParseShaderInputConnectionProperty(std::set<std::string> &table, /* inout */
  const std::string prop_name,
  const Property &prop,
  const std::string &name,
  TypedConnection<value::token> &target) /* out */
{
  ParseResult ret;
  ret.code = ParseResult::ResultCode::InternalError;

#if 0
  if (prop_name.compare(name + ".connect") == 0) {
    std::string propname = removeSuffix(name, ".connect");
    if (table.count(propname)) {
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }
    if (auto pv = prop.get_relationTarget()) {
      TypedConnection<value::token> conn;
      conn.set(pv.value());
      conn.metas() = prop.get_attribute().metas();
      target = conn;
      table.insert(propname);
      ret.code = ParseResult::ResultCode::Success;
      return ret;
    } else {
      ret.code = ParseResult::ResultCode::InternalError;
      ret.err = "Property does not contain connectionPath.";
      return ret;
    }
#endif
  if (prop_name.compare(name) == 0) {
    if (table.count(name)) {
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }

    DCOUT("is_attribute = " << prop.is_attribute());
    DCOUT("is_attribute_connection = " << prop.is_attribute_connection());

    // allow empty value
    if (prop.is_empty()) {
      target.set_empty();
      target.metas() = prop.get_attribute().metas();
      table.insert(prop_name);
      ret.code = ParseResult::ResultCode::Success;
      return ret;
    } else if (prop.is_attribute_connection()) {
      const Attribute &attr = prop.get_attribute();
      if (attr.is_connection()) {
        target.set(attr.connections());
        target.metas() = prop.get_attribute().metas();

        table.insert(prop_name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;
      } else {
        ret.code = ParseResult::ResultCode::InternalError;
        ret.err = "Property is invalid Attribute connection.";
        return ret;
      }
    } else {
      ret.code = ParseResult::ResultCode::InternalError;
      ret.err = fmt::format("Property `{}` must be Attribute connection.", prop_name);
      return ret;
    }
  }

  ret.code = ParseResult::ResultCode::Unmatched;
  return ret;
}

// Rel with single targetPath(or empty)
#define PARSE_SINGLE_TARGET_PATH_RELATION(__table, __prop, __propname, __target) \
  if (prop.first == __propname) { \
    if (__table.count(__propname)) { \
       continue; \
    } \
    if (!prop.second.is_relationship()) { \
      PUSH_ERROR_AND_RETURN(fmt::format("Property `{}` must be a Relationship.", __propname)); \
    } \
    const Relationship &rel = prop.second.get_relationship(); \
    if (rel.is_path()) { \
      __target = rel; \
      table.insert(prop.first); \
      DCOUT("Added rel " << __propname); \
      continue; \
    } else if (rel.is_pathvector()) { \
      if (rel.targetPathVector.size() == 1) { \
        __target = rel; \
        table.insert(prop.first); \
        DCOUT("Added rel " << __propname); \
        continue; \
      } \
      PUSH_ERROR_AND_RETURN(fmt::format("`{}` target is empty or has mutiple Paths. Must be single Path.", __propname)); \
    } else if (!rel.has_value()) { \
      /* define-only. accept  */ \
      __target = rel; \
      table.insert(prop.first); \
      DCOUT("Added rel " << __propname); \
    } else if (rel.is_blocked()) { \
      __target = rel; \
      table.insert(prop.first); \
      DCOUT("Added ValueBlocked rel " << __propname); \
    } else { \
      PUSH_ERROR_AND_RETURN(fmt::format("Internal error. Property `{}` is not a valid Relationship.", __propname)); \
    } \
  }

// Rel with targetPaths(single path or array of Paths)
#define PARSE_TARGET_PATHS_RELATION(__table, __prop, __propname, __target) \
  if (prop.first == __propname) { \
    if (__table.count(__propname)) { \
       continue; \
    } \
    if (!prop.second.is_relationship()) { \
      PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", __propname)); \
    } \
    const Relationship &rel = prop.second.get_relationship(); \
    __target = rel; \
    table.insert(prop.first); \
    DCOUT("Added rel " << __propname); \
    continue; \
  }


#define PARSE_SHADER_TERMINAL_ATTRIBUTE(__table, __prop, __name, __klass, __target) { \
  ParseResult ret = ParseShaderOutputTerminalAttribute(__table, __prop.first, __prop.second, __name, __target); \
  if (ret.code == ParseResult::ResultCode::Success || ret.code == ParseResult::ResultCode::AlreadyProcessed) { \
    DCOUT("Added shader terminal attribute: " << __name); \
    continue; /* got it */\
  } else if (ret.code == ParseResult::ResultCode::Unmatched) { \
    /* go next */ \
  } else { \
    PUSH_ERROR_AND_RETURN(fmt::format("Parsing shader output property `{}` failed. Error: {}", __name, ret.err)); \
  } \
}

#if 0 // TODO: Remove since not used.
#define PARSE_SHADER_OUTPUT_PROPERTY(__table, __prop, __name, __klass, __target) { \
  ParseResult ret = ParseShaderOutputProperty(__table, __prop.first, __prop.second, __name, __target); \
  if (ret.code == ParseResult::ResultCode::Success || ret.code == ParseResult::ResultCode::AlreadyProcessed) { \
    DCOUT("Added shader output property: " << __name); \
    continue; /* got it */\
  } else if (ret.code == ParseResult::ResultCode::Unmatched) { \
    /* go next */ \
  } else { \
    PUSH_ERROR_AND_RETURN(fmt::format("Parsing shader output property `{}` failed. Error: {}", __name, ret.err)); \
  } \
}
#endif

#define PARSE_SHADER_INPUT_CONNECTION_PROPERTY(__table, __prop, __name, __klass, __target) { \
  ParseResult ret = ParseShaderInputConnectionProperty(__table, __prop.first, __prop.second, __name, __target); \
  if (ret.code == ParseResult::ResultCode::Success || ret.code == ParseResult::ResultCode::AlreadyProcessed) { \
    DCOUT("Added shader input connection: " << __name); \
    continue; /* got it */\
  } else if (ret.code == ParseResult::ResultCode::Unmatched) { \
    /* go next */ \
  } else { \
    PUSH_ERROR_AND_RETURN(fmt::format("Parsing shader property `{}` failed. Error: {}", __name, ret.err)); \
  } \
}

template <class E>
static nonstd::expected<bool, std::string> CheckAllowedTokens(
    const std::vector<std::pair<E, const char *>> &allowedTokens,
    const std::string &tok) {
  if (allowedTokens.empty()) {
    return true;
  }

  for (size_t i = 0; i < allowedTokens.size(); i++) {
    if (tok.compare(std::get<1>(allowedTokens[i])) == 0) {
      return true;
    }
  }

  std::vector<std::string> toks;
  for (size_t i = 0; i < allowedTokens.size(); i++) {
    toks.push_back(std::get<1>(allowedTokens[i]));
  }

  std::string s = join(", ", tinyusdz::quote(toks));

  return nonstd::make_unexpected("Allowed tokens are [" + s + "] but got " +
                                 quote(tok) + ".");
};

template <typename T>
nonstd::expected<T, std::string> EnumHandler(
    const std::string &prop_name, const std::string &tok,
    const std::vector<std::pair<T, const char *>> &enums) {
  auto ret = CheckAllowedTokens<T>(enums, tok);
  if (!ret) {
    return nonstd::make_unexpected(ret.error());
  }

  for (auto &item : enums) {
    if (tok == item.second) {
      return item.first;
    }
  }
  // Should never reach here, though.
  return nonstd::make_unexpected(
      quote(tok) + " is an invalid token for attribute `" + prop_name + "`");
}


}